

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

string * __thiscall
glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructors1<glcts::ArraysOfArrays::Interface::GL>
::recursively_initialise
          (string *__return_storage_ptr__,
          ConstructorsAndUnsizedDeclConstructors1<glcts::ArraysOfArrays::Interface::GL> *this,
          string *var_type,size_t dimension_index,string *init_string)

{
  bool bVar1;
  bool bVar2;
  size_t indent_index;
  size_t sVar3;
  string prefix;
  allocator<char> local_111;
  size_t local_110;
  ConstructorsAndUnsizedDeclConstructors1<glcts::ArraysOfArrays::Interface::GL> *local_108;
  string *local_100;
  string *local_f8;
  string local_f0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_110 = dimension_index;
  local_108 = this;
  local_100 = var_type;
  if (dimension_index == 0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>(local_d0,"\n",(allocator<char> *)&local_f0);
    for (sVar3 = local_110; sVar3 < 9; sVar3 = sVar3 + 1) {
      std::__cxx11::string::append((char *)local_d0);
    }
    std::__cxx11::string::string(local_90,(string *)local_100);
    std::__cxx11::string::string<std::allocator<char>>(local_b0,"[]",&local_111);
    (*(local_108->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
      super_TestNode._vptr_TestNode[6])(&local_f0,local_108,local_90,local_b0,local_110);
    std::__cxx11::string::append(local_d0);
    local_f8 = init_string;
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::append((char *)local_d0);
    local_110 = local_110 - 1;
    bVar2 = false;
    do {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::string((string *)&local_50,(string *)local_100);
      std::__cxx11::string::string((string *)&local_70,(string *)local_f8);
      recursively_initialise(&local_f0,local_108,&local_50,local_110,&local_70);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::assign((char *)local_d0);
      bVar1 = !bVar2;
      bVar2 = true;
    } while (bVar1);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConstructorsAndUnsizedDeclConstructors1<API>::recursively_initialise(std::string var_type,
																				 size_t		 dimension_index,
																				 std::string init_string)
{
	std::string temp_string;

	if (dimension_index == 0)
	{
		temp_string = init_string;
	}
	else
	{
		std::string prefix = "\n";

		for (size_t indent_index = dimension_index; indent_index < (API::MAX_ARRAY_DIMENSIONS + 1); indent_index++)
		{
			prefix += "    ";
		}

		prefix += this->extend_string(var_type, "[]", dimension_index);
		prefix += "(";
		for (int sub_script_index = 0; sub_script_index < 2; sub_script_index++)
		{
			temp_string += prefix;
			temp_string += recursively_initialise(var_type, dimension_index - 1, init_string);
			prefix = ", ";
			if (sub_script_index == 1)
			{
				break;
			}
		}
		temp_string += ")";
	}

	return temp_string;
}